

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

void cleanup_p_race(void)

{
  player_race *ppVar1;
  player_race_list *ppVar2;
  player_race_list *old;
  player_race_list *list;
  player_race *next;
  player_race *p;
  
  next = races;
  while (next != (player_race *)0x0) {
    ppVar1 = next->next;
    old = next->dislikes;
    while (old != (player_race_list *)0x0) {
      string_free(old->name);
      ppVar2 = old->next;
      mem_free(old);
      old = ppVar2;
    }
    string_free(next->name);
    string_free(next->hometown);
    mem_free(next);
    next = ppVar1;
  }
  return;
}

Assistant:

static void cleanup_p_race(void)
{
	struct player_race *p = races;
	struct player_race *next;

	while (p) {
		struct player_race_list *list = p->dislikes;
		next = p->next;
		while (list) {
			struct player_race_list *old = list;
			string_free((char *)list->name);
			list = list->next;
			mem_free(old);
		}
		string_free((char *)p->name);
		string_free(p->hometown);
		mem_free(p);
		p = next;
	}
}